

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arbitrary_associative_containers.h
# Opt level: O0

vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
* testinator::anon_unknown_6::
  Arbitrary_Assoc<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
  ::shrink(vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
           *__return_storage_ptr__,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *c)

{
  _Node_iterator_base<int,_false> __first;
  bool bVar1;
  size_type sVar2;
  reference pvVar3;
  reference __x;
  const_iterator __last;
  reference this;
  iterator __i;
  pair<std::__detail::_Node_iterator<int,_true,_false>,_bool> pVar4;
  insert_iterator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>
  __result;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_d8;
  _Node_iterator_base<int,_false> local_98;
  _Node_iterator_base<int,_false> local_90;
  undefined1 local_88;
  _Node_iterator_base<int,_false> local_80;
  size_type count;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> local_68;
  _Node_iterator_base<int,_false> local_30;
  const_iterator it;
  size_type l;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *c_local;
  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
  *v;
  
  ::std::
  vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__);
  bVar1 = ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::empty
                    (c);
  if (!bVar1) {
    sVar2 = ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
            size(c);
    it.super__Node_iterator_base<int,_false>._M_cur = (_Node_iterator_base<int,_false>)(sVar2 >> 1);
    local_30._M_cur =
         (__node_type *)
         ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::cbegin
                   (c);
    local_68._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    local_68._M_h._M_rehash_policy._4_4_ = 0;
    local_68._M_h._M_rehash_policy._M_next_resize = 0;
    local_68._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_68._M_h._M_element_count = 0;
    local_68._M_h._M_buckets = (__buckets_ptr)0x0;
    local_68._M_h._M_bucket_count = 0;
    local_68._M_h._M_single_bucket = (__node_base_ptr)0x0;
    ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    unordered_set(&local_68);
    ::std::
    vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
    ::push_back(__return_storage_ptr__,&local_68);
    ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
    ~unordered_set(&local_68);
    local_80._M_cur = (__node_type *)0x0;
    while (local_80._M_cur < (ulong)it.super__Node_iterator_base<int,_false>._M_cur) {
      pvVar3 = ::std::
               vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,0);
      __x = ::std::__detail::_Node_const_iterator<int,_true,_false>::operator*
                      ((_Node_const_iterator<int,_true,_false> *)&local_30);
      pVar4 = ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
              insert(pvVar3,__x);
      local_90._M_cur = (__node_type *)pVar4.first.super__Node_iterator_base<int,_false>._M_cur;
      local_88 = pVar4.second;
      local_80._M_cur =
           (__node_type *)((long)&((local_80._M_cur)->super__Hash_node_base)._M_nxt + 1);
      local_98._M_cur =
           (__node_type *)
           ::std::__detail::_Node_const_iterator<int,_true,_false>::operator++
                     ((_Node_const_iterator<int,_true,_false> *)&local_30,0);
    }
    if (it.super__Node_iterator_base<int,_false>._M_cur != (__node_type *)0x0) {
      local_d8._M_h._M_rehash_policy._M_max_load_factor = 0.0;
      local_d8._M_h._M_rehash_policy._4_4_ = 0;
      local_d8._M_h._M_rehash_policy._M_next_resize = 0;
      local_d8._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      local_d8._M_h._M_element_count = 0;
      local_d8._M_h._M_buckets = (__buckets_ptr)0x0;
      local_d8._M_h._M_bucket_count = 0;
      local_d8._M_h._M_single_bucket = (__node_base_ptr)0x0;
      ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      unordered_set(&local_d8);
      ::std::
      vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
      ::push_back(__return_storage_ptr__,&local_d8);
      ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
      ~unordered_set(&local_d8);
      __first._M_cur = local_30._M_cur;
      __last = ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               cend(c);
      pvVar3 = ::std::
               vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
               ::operator[](__return_storage_ptr__,1);
      this = ::std::
             vector<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>,_std::allocator<std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>_>_>
             ::operator[](__return_storage_ptr__,1);
      __i = ::std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
            begin(this);
      __result = ::std::
                 inserter<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>
                           (pvVar3,__i);
      ::std::
      copy<std::__detail::_Node_const_iterator<int,true,false>,std::insert_iterator<std::unordered_set<int,std::hash<int>,std::equal_to<int>,std::allocator<int>>>>
                ((_Node_const_iterator<int,_true,_false>)__first._M_cur,
                 (_Node_const_iterator<int,_true,_false>)
                 __last.super__Node_iterator_base<int,_false>._M_cur,__result);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<C> shrink(const C& c)
      {
        std::vector<C> v;
        if (c.empty()) return v;
        auto l = c.size() / 2;
        auto it = c.cbegin();
        v.push_back(C());
        for (decltype(l) count = 0; count < l; count++, it++)
          v[0].insert(*it);
        if (l > 0)
        {
          v.push_back(C());
          copy(it, c.cend(), std::inserter(v[1], v[1].begin()));
        }
        return v;
      }